

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O0

void __thiscall
cubeb_passthrough_resampler_fill_eq_input_Test::TestBody
          (cubeb_passthrough_resampler_fill_eq_input_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  long got;
  uint32_t i;
  float output [64];
  float input [64];
  long output_frame_count;
  long input_frame_count;
  passthrough_resampler<float> resampler;
  uint32_t sample_rate;
  uint32_t channels;
  uint32_t in_stack_fffffffffffffd40;
  uint32_t in_stack_fffffffffffffd44;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd48;
  Message *in_stack_fffffffffffffd50;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  AssertHelper local_298;
  Message local_290;
  AssertionResult local_288;
  long local_278;
  undefined4 in_stack_fffffffffffffd90;
  uint uVar3;
  void *in_stack_fffffffffffffd98;
  long *in_stack_fffffffffffffda0;
  void *in_stack_fffffffffffffda8;
  passthrough_resampler<float> *in_stack_fffffffffffffdb0;
  float local_168 [64];
  undefined8 local_68;
  long local_60;
  undefined4 local_10;
  uint local_c;
  
  local_c = 2;
  local_10 = 0xac44;
  passthrough_resampler<float>::passthrough_resampler
            ((passthrough_resampler<float> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (cubeb_stream *)in_stack_fffffffffffffd58.ptr_,
             (cubeb_data_callback)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48.ptr_,
             in_stack_fffffffffffffd44,in_stack_fffffffffffffd40);
  local_60 = 0x20;
  local_68 = 0x20;
  memset(local_168,0,0x100);
  memset(&stack0xfffffffffffffd98,0,0x100);
  for (uVar3 = 0; (long)(ulong)uVar3 < (long)(local_60 * (ulong)local_c); uVar3 = uVar3 + 1) {
    local_168[uVar3] = (float)((double)uVar3 * 0.01);
  }
  local_278 = passthrough_resampler<float>::fill
                        (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                         in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                         CONCAT44(uVar3,in_stack_fffffffffffffd90));
  testing::internal::EqHelper<false>::Compare<long,long>
            ((char *)in_stack_fffffffffffffd58.ptr_,(char *)in_stack_fffffffffffffd50,
             (long *)in_stack_fffffffffffffd48.ptr_,
             (long *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_288);
  if (!bVar1) {
    testing::Message::Message(in_stack_fffffffffffffd50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10c4fe);
    testing::internal::AssertHelper::AssertHelper
              (&local_298,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
               ,0x3a2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_298,&local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_298);
    testing::Message::~Message((Message *)0x10c53f);
  }
  uVar3 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c55b);
  if (uVar3 == 0) {
    testing::internal::EqHelper<false>::Compare<long,long>
              ((char *)in_stack_fffffffffffffd58.ptr_,(char *)in_stack_fffffffffffffd50,
               (long *)in_stack_fffffffffffffd48.ptr_,
               (long *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffd50);
    if (!bVar1) {
      testing::Message::Message(in_stack_fffffffffffffd50);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10c5b7);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffd40,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                 ,0x3a4,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffd40,(Message *)&stack0xfffffffffffffd48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd40);
      testing::Message::~Message((Message *)0x10c5f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c614);
  }
  passthrough_resampler<float>::~passthrough_resampler
            ((passthrough_resampler<float> *)
             CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  return;
}

Assistant:

TEST(cubeb, passthrough_resampler_fill_eq_input) {
  uint32_t channels = 2;
  uint32_t sample_rate = 44100;
  passthrough_resampler<float> resampler =
    passthrough_resampler<float>(nullptr, passthrough_resampler_fill_eq_input,
                                 nullptr, channels, sample_rate);

  long input_frame_count = 32;
  long output_frame_count = 32;
  float input[64] = {};
  float output[64] = {};
  for (uint32_t i = 0; i < input_frame_count * channels; ++i) {
    input[i] = 0.01 * i;
  }
  long got = resampler.fill(input, &input_frame_count, output, output_frame_count);
  ASSERT_EQ(got, output_frame_count);
  // Input frames used must be equal to output frames.
  ASSERT_EQ(input_frame_count, output_frame_count);
}